

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsort_s.c
# Opt level: O3

int main(void)

{
  uint *puVar1;
  byte *pbVar2;
  byte *pbVar3;
  uint *puVar4;
  char tmp_3;
  uint *puVar5;
  uint *puVar6;
  byte *pbVar7;
  ulong uVar8;
  uint *puVar9;
  byte *pbVar10;
  char tmp_1;
  byte bVar11;
  byte bVar12;
  uint *puVar13;
  byte *pbVar14;
  char tmp;
  byte bVar15;
  undefined8 *puVar16;
  undefined8 *puVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  char s [19];
  char *stack [64];
  undefined4 local_248;
  char cStack_244;
  char cStack_243;
  char cStack_242;
  char cStack_241;
  char cStack_240;
  char cStack_23f;
  char cStack_23e;
  char cStack_23d;
  char cStack_23c;
  char cStack_23b;
  char cStack_23a;
  char cStack_239;
  char cStack_238;
  char cStack_237;
  char acStack_236 [14];
  undefined8 local_228 [64];
  
  puVar4 = (uint *)acStack_236;
  local_248._0_1_ = 0x73;
  local_248._1_1_ = 'h';
  local_248._2_1_ = 'r';
  local_248._3_1_ = 'e';
  cStack_244 = 'i';
  cStack_243 = 'c';
  cStack_242 = 'n';
  cStack_241 = 'y';
  cStack_240 = 'j';
  cStack_23f = 'q';
  cStack_23e = 'p';
  cStack_23d = 'v';
  cStack_23c = 'o';
  cStack_23b = 'z';
  cStack_23a = 'x';
  cStack_239 = 'm';
  cStack_238 = 'b';
  cStack_237 = 't';
  acStack_236[0] = '\0';
  puVar1 = &local_248;
  puVar5 = puVar4;
  puVar16 = local_228;
LAB_0010372c:
  do {
    puVar6 = (uint *)((long)puVar1 + 1);
    puVar17 = puVar16;
    while (7 < (ulong)((long)puVar5 - (long)puVar1)) {
      uVar8 = (ulong)((long)puVar5 - (long)puVar1) >> 1;
      bVar11 = *(byte *)((long)puVar1 + uVar8);
      *(byte *)((long)puVar1 + uVar8) = (byte)*puVar1;
      *(byte *)puVar1 = bVar11;
      puVar9 = (uint *)((long)puVar5 + -1);
      bVar12 = *(byte *)((long)puVar1 + 1);
      bVar15 = *(byte *)((long)puVar5 + -1);
      if (bVar15 < bVar12) {
        *(byte *)((long)puVar1 + 1) = bVar15;
        *(byte *)puVar9 = bVar12;
        bVar11 = (byte)*puVar1;
        bVar15 = bVar12;
      }
      if (bVar15 < bVar11) {
        *(byte *)puVar1 = bVar15;
        *(byte *)puVar9 = bVar11;
        bVar11 = (byte)*puVar1;
      }
      bVar12 = *(byte *)puVar6;
      puVar13 = puVar6;
      if (bVar11 < bVar12) {
        *(byte *)((long)puVar1 + 1) = bVar11;
        *(byte *)puVar1 = bVar12;
        bVar11 = bVar12;
      }
      while( true ) {
        lVar18 = (long)puVar5 - (long)puVar13;
        do {
          bVar12 = *(byte *)((long)puVar13 + 1);
          puVar13 = (uint *)((long)puVar13 + 1);
          lVar18 = lVar18 + -1;
        } while (bVar12 < bVar11);
        lVar20 = (long)puVar9 - (long)puVar1;
        do {
          bVar15 = *(byte *)((long)puVar9 + -1);
          puVar9 = (uint *)((long)puVar9 + -1);
          lVar20 = lVar20 + -1;
        } while (bVar11 < bVar15);
        if (puVar9 < puVar13) break;
        *(byte *)puVar13 = bVar15;
        *(byte *)puVar9 = bVar12;
        bVar11 = (byte)*puVar1;
      }
      *(byte *)puVar1 = bVar15;
      *(byte *)puVar9 = bVar11;
      puVar16 = puVar17 + 2;
      if (lVar18 < lVar20) {
        *puVar17 = puVar1;
        puVar17[1] = puVar9;
        puVar1 = puVar13;
        goto LAB_0010372c;
      }
      *puVar17 = puVar13;
      puVar17[1] = puVar5;
      puVar5 = puVar9;
      puVar17 = puVar16;
    }
    if (puVar6 < puVar5) {
      lVar18 = 0;
      do {
        bVar12 = (byte)*puVar1;
        bVar15 = *(byte *)((long)puVar1 + 1);
        if (bVar15 < bVar12) {
          lVar20 = 0;
          do {
            *(byte *)((long)puVar1 + lVar20) = bVar15;
            *(byte *)((long)puVar1 + lVar20 + 1) = bVar12;
            if (lVar18 == lVar20) break;
            bVar12 = *(byte *)((long)puVar1 + lVar20 + -1);
            lVar20 = lVar20 + -1;
          } while (bVar15 < bVar12);
        }
        puVar6 = (uint *)((long)puVar6 + 1);
        puVar1 = (uint *)((long)puVar1 + 1);
        lVar18 = lVar18 + -1;
      } while (puVar6 < puVar5);
    }
    if (puVar17 == local_228) {
      auVar25[0] = -(local_248._3_1_ == 'h');
      auVar25[1] = -(cStack_244 == 'i');
      auVar25[2] = -(cStack_243 == 'j');
      auVar25[3] = -(cStack_242 == 'm');
      auVar25[4] = -(cStack_241 == 'n');
      auVar25[5] = -(cStack_240 == 'o');
      auVar25[6] = -(cStack_23f == 'p');
      auVar25[7] = -(cStack_23e == 'q');
      auVar25[8] = -(cStack_23d == 'r');
      auVar25[9] = -(cStack_23c == 's');
      auVar25[10] = -(cStack_23b == 't');
      auVar25[0xb] = -(cStack_23a == 'v');
      auVar25[0xc] = -(cStack_239 == 'x');
      auVar25[0xd] = -(cStack_238 == 'y');
      auVar25[0xe] = -(cStack_237 == 'z');
      auVar25[0xf] = -(acStack_236[0] == '\0');
      auVar21[0] = -((byte)local_248 == 'b');
      auVar21[1] = -(local_248._1_1_ == 'c');
      auVar21[2] = -(local_248._2_1_ == 'e');
      auVar21[3] = -(local_248._3_1_ == 'h');
      auVar21[4] = -(cStack_244 == 'i');
      auVar21[5] = -(cStack_243 == 'j');
      auVar21[6] = -(cStack_242 == 'm');
      auVar21[7] = -(cStack_241 == 'n');
      auVar21[8] = -(cStack_240 == 'o');
      auVar21[9] = -(cStack_23f == 'p');
      auVar21[10] = -(cStack_23e == 'q');
      auVar21[0xb] = -(cStack_23d == 'r');
      auVar21[0xc] = -(cStack_23c == 's');
      auVar21[0xd] = -(cStack_23b == 't');
      auVar21[0xe] = -(cStack_23a == 'v');
      auVar21[0xf] = -(cStack_239 == 'x');
      auVar21 = auVar21 & auVar25;
      if ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) != 0xffff) {
        TEST_RESULTS = TEST_RESULTS + 1;
        printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/qsort_s.c, line %d - %s\n"
               ,0xb9,"strcmp( s, sorted1 ) == 0");
      }
      local_248._0_1_ = 0x73;
      local_248._1_1_ = 'h';
      local_248._2_1_ = 'r';
      local_248._3_1_ = 'e';
      cStack_244 = 'i';
      cStack_243 = 'c';
      cStack_242 = 'n';
      cStack_241 = 'y';
      cStack_240 = 'j';
      cStack_23f = 'q';
      cStack_23e = 'p';
      cStack_23d = 'v';
      cStack_23c = 'o';
      cStack_23b = 'z';
      cStack_23a = 'x';
      cStack_239 = 'm';
      cStack_238 = 'b';
      cStack_237 = 't';
      acStack_236[0] = '\0';
      puVar1 = &local_248;
      puVar16 = local_228;
LAB_001038c0:
      do {
        puVar5 = (uint *)((long)puVar1 + 2);
        puVar17 = puVar16;
        while (0xe < (ulong)((long)puVar4 - (long)puVar1)) {
          uVar8 = (ulong)((long)puVar4 - (long)puVar1) >> 2;
          lVar18 = 0;
          do {
            bVar12 = *(byte *)((long)puVar1 + lVar18 + uVar8 * 2);
            *(byte *)((long)puVar1 + lVar18 + uVar8 * 2) = *(byte *)((long)puVar1 + lVar18);
            *(byte *)((long)puVar1 + lVar18) = bVar12;
            lVar18 = lVar18 + 1;
          } while (lVar18 != 2);
          puVar6 = (uint *)((long)puVar4 + -2);
          bVar12 = *(byte *)((long)puVar4 + -2);
          if (bVar12 < *(byte *)puVar5) {
            lVar18 = 0;
            do {
              bVar12 = *(byte *)((long)puVar5 + lVar18);
              *(byte *)((long)puVar5 + lVar18) = *(byte *)((long)puVar6 + lVar18);
              *(byte *)((long)puVar6 + lVar18) = bVar12;
              lVar18 = lVar18 + 1;
            } while (lVar18 != 2);
            bVar12 = *(byte *)puVar6;
          }
          bVar15 = (byte)*puVar1;
          if (bVar12 < bVar15) {
            lVar18 = 0;
            do {
              bVar12 = *(byte *)((long)puVar1 + lVar18);
              *(byte *)((long)puVar1 + lVar18) = *(byte *)((long)puVar6 + lVar18);
              *(byte *)((long)puVar6 + lVar18) = bVar12;
              lVar18 = lVar18 + 1;
            } while (lVar18 != 2);
            bVar15 = (byte)*puVar1;
          }
          puVar9 = puVar5;
          if (bVar15 < *(byte *)puVar5) {
            *puVar1 = *puVar1 << 0x10 | *puVar1 >> 0x10;
          }
          while( true ) {
            lVar18 = (long)puVar4 - (long)puVar9;
            puVar13 = puVar9;
            do {
              puVar9 = (uint *)((long)puVar13 + 2);
              lVar18 = lVar18 + -2;
              pbVar2 = (byte *)((long)puVar13 + 2);
              puVar13 = puVar9;
            } while (*pbVar2 < (byte)*puVar1);
            lVar20 = (long)puVar6 - (long)puVar1;
            puVar13 = puVar6;
            do {
              puVar6 = (uint *)((long)puVar13 + -2);
              lVar20 = lVar20 + -2;
              pbVar2 = (byte *)((long)puVar13 + -2);
              puVar13 = puVar6;
            } while ((byte)*puVar1 < *pbVar2);
            if (puVar6 < puVar9) break;
            lVar18 = 0;
            do {
              bVar12 = *(byte *)((long)puVar9 + lVar18);
              *(byte *)((long)puVar9 + lVar18) = *(byte *)((long)puVar6 + lVar18);
              *(byte *)((long)puVar6 + lVar18) = bVar12;
              lVar18 = lVar18 + 1;
            } while (lVar18 != 2);
          }
          lVar19 = 0;
          do {
            bVar12 = *(byte *)((long)puVar1 + lVar19);
            *(byte *)((long)puVar1 + lVar19) = *(byte *)((long)puVar6 + lVar19);
            *(byte *)((long)puVar6 + lVar19) = bVar12;
            lVar19 = lVar19 + 1;
          } while (lVar19 != 2);
          puVar16 = puVar17 + 2;
          if (lVar18 < lVar20) {
            *puVar17 = puVar1;
            puVar17[1] = puVar6;
            puVar1 = puVar9;
            goto LAB_001038c0;
          }
          *puVar17 = puVar9;
          puVar17[1] = puVar4;
          puVar4 = puVar6;
          puVar17 = puVar16;
        }
        if (puVar5 < puVar4) {
          lVar18 = 0;
          do {
            if (*(byte *)((long)puVar1 + 2) < (byte)*puVar1) {
              lVar20 = 0;
              do {
                puVar6 = (uint *)((long)puVar1 + lVar20);
                *puVar6 = *puVar6 << 0x10 | *puVar6 >> 0x10;
                if (lVar18 == lVar20) break;
                lVar19 = lVar20 + -2;
                pbVar2 = (byte *)((long)puVar1 + lVar20);
                lVar20 = lVar20 + -2;
              } while (*pbVar2 < *(byte *)((long)puVar1 + lVar19));
            }
            puVar5 = (uint *)((long)puVar5 + 2);
            puVar1 = (uint *)((long)puVar1 + 2);
            lVar18 = lVar18 + -2;
          } while (puVar5 < puVar4);
        }
        if (puVar17 == local_228) {
          auVar26[0] = -(local_248._3_1_ == 'c');
          auVar26[1] = -(cStack_244 == 'j');
          auVar26[2] = -(cStack_243 == 'q');
          auVar26[3] = -(cStack_242 == 'n');
          auVar26[4] = -(cStack_241 == 'y');
          auVar26[5] = -(cStack_240 == 'o');
          auVar26[6] = -(cStack_23f == 'z');
          auVar26[7] = -(cStack_23e == 'p');
          auVar26[8] = -(cStack_23d == 'v');
          auVar26[9] = -(cStack_23c == 'r');
          auVar26[10] = -(cStack_23b == 'e');
          auVar26[0xb] = -(cStack_23a == 's');
          auVar26[0xc] = -(cStack_239 == 'h');
          auVar26[0xd] = -(cStack_238 == 'x');
          auVar26[0xe] = -(cStack_237 == 'm');
          auVar26[0xf] = -(acStack_236[0] == '\0');
          auVar22[0] = -((byte)local_248 == 0x62);
          auVar22[1] = -(local_248._1_1_ == 't');
          auVar22[2] = -(local_248._2_1_ == 'i');
          auVar22[3] = -(local_248._3_1_ == 'c');
          auVar22[4] = -(cStack_244 == 'j');
          auVar22[5] = -(cStack_243 == 'q');
          auVar22[6] = -(cStack_242 == 'n');
          auVar22[7] = -(cStack_241 == 'y');
          auVar22[8] = -(cStack_240 == 'o');
          auVar22[9] = -(cStack_23f == 'z');
          auVar22[10] = -(cStack_23e == 'p');
          auVar22[0xb] = -(cStack_23d == 'v');
          auVar22[0xc] = -(cStack_23c == 'r');
          auVar22[0xd] = -(cStack_23b == 'e');
          auVar22[0xe] = -(cStack_23a == 's');
          auVar22[0xf] = -(cStack_239 == 'h');
          auVar22 = auVar22 & auVar26;
          if ((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar22[0xf] >> 7) << 0xf) != 0xffff) {
            TEST_RESULTS = TEST_RESULTS + 1;
            printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/qsort_s.c, line %d - %s\n"
                   ,0xbc,"strcmp( s, sorted2 ) == 0");
          }
          pbVar2 = (byte *)((long)&local_248 + 1);
          local_248._0_1_ = 0x73;
          local_248._1_1_ = 'h';
          local_248._2_1_ = 'r';
          local_248._3_1_ = 'e';
          cStack_244 = 'i';
          cStack_243 = 'c';
          cStack_242 = 'n';
          cStack_241 = 'y';
          cStack_240 = 'j';
          cStack_23f = 'q';
          cStack_23e = 'p';
          cStack_23d = 'v';
          cStack_23c = 'o';
          cStack_23b = 'z';
          cStack_23a = 'x';
          cStack_239 = 'm';
          cStack_238 = 'b';
          cStack_237 = 't';
          acStack_236[0] = '\0';
          pbVar3 = (byte *)&local_248;
          puVar16 = local_228;
LAB_00103ab6:
          do {
            pbVar7 = pbVar3 + 1;
            puVar17 = puVar16;
            while (7 < (ulong)((long)pbVar2 - (long)pbVar3)) {
              uVar8 = (ulong)((long)pbVar2 - (long)pbVar3) >> 1;
              bVar11 = pbVar3[uVar8];
              pbVar3[uVar8] = *pbVar3;
              *pbVar3 = bVar11;
              pbVar10 = pbVar2 + -1;
              bVar12 = pbVar3[1];
              bVar15 = pbVar2[-1];
              if (bVar15 < bVar12) {
                pbVar3[1] = bVar15;
                *pbVar10 = bVar12;
                bVar11 = *pbVar3;
                bVar15 = bVar12;
              }
              if (bVar15 < bVar11) {
                *pbVar3 = bVar15;
                *pbVar10 = bVar11;
                bVar11 = *pbVar3;
              }
              bVar12 = *pbVar7;
              pbVar14 = pbVar7;
              if (bVar11 < bVar12) {
                pbVar3[1] = bVar11;
                *pbVar3 = bVar12;
                bVar11 = bVar12;
              }
              while( true ) {
                lVar18 = (long)pbVar2 - (long)pbVar14;
                do {
                  bVar12 = pbVar14[1];
                  pbVar14 = pbVar14 + 1;
                  lVar18 = lVar18 + -1;
                } while (bVar12 < bVar11);
                lVar20 = (long)pbVar10 - (long)pbVar3;
                do {
                  bVar15 = pbVar10[-1];
                  pbVar10 = pbVar10 + -1;
                  lVar20 = lVar20 + -1;
                } while (bVar11 < bVar15);
                if (pbVar10 < pbVar14) break;
                *pbVar14 = bVar15;
                *pbVar10 = bVar12;
                bVar11 = *pbVar3;
              }
              *pbVar3 = bVar15;
              *pbVar10 = bVar11;
              puVar16 = puVar17 + 2;
              if (lVar18 < lVar20) {
                *puVar17 = pbVar3;
                puVar17[1] = pbVar10;
                pbVar3 = pbVar14;
                goto LAB_00103ab6;
              }
              *puVar17 = pbVar14;
              puVar17[1] = pbVar2;
              pbVar2 = pbVar10;
              puVar17 = puVar16;
            }
            if (pbVar7 < pbVar2) {
              lVar18 = 0;
              do {
                bVar12 = *pbVar3;
                bVar15 = pbVar3[1];
                if (bVar15 < bVar12) {
                  lVar20 = 0;
                  do {
                    pbVar3[lVar20] = bVar15;
                    pbVar3[lVar20 + 1] = bVar12;
                    if (lVar18 == lVar20) break;
                    bVar12 = pbVar3[lVar20 + -1];
                    lVar20 = lVar20 + -1;
                  } while (bVar15 < bVar12);
                }
                pbVar7 = pbVar7 + 1;
                pbVar3 = pbVar3 + 1;
                lVar18 = lVar18 + -1;
              } while (pbVar7 < pbVar2);
            }
            if (puVar17 == local_228) {
              auVar27[0] = -(local_248._3_1_ == 'e');
              auVar27[1] = -(cStack_244 == 'i');
              auVar27[2] = -(cStack_243 == 'c');
              auVar27[3] = -(cStack_242 == 'n');
              auVar27[4] = -(cStack_241 == 'y');
              auVar27[5] = -(cStack_240 == 'j');
              auVar27[6] = -(cStack_23f == 'q');
              auVar27[7] = -(cStack_23e == 'p');
              auVar27[8] = -(cStack_23d == 'v');
              auVar27[9] = -(cStack_23c == 'o');
              auVar27[10] = -(cStack_23b == 'z');
              auVar27[0xb] = -(cStack_23a == 'x');
              auVar27[0xc] = -(cStack_239 == 'm');
              auVar27[0xd] = -(cStack_238 == 'b');
              auVar27[0xe] = -(cStack_237 == 't');
              auVar27[0xf] = -(acStack_236[0] == '\0');
              auVar23[0] = -((byte)local_248 == 0x73);
              auVar23[1] = -(local_248._1_1_ == 'h');
              auVar23[2] = -(local_248._2_1_ == 'r');
              auVar23[3] = -(local_248._3_1_ == 'e');
              auVar23[4] = -(cStack_244 == 'i');
              auVar23[5] = -(cStack_243 == 'c');
              auVar23[6] = -(cStack_242 == 'n');
              auVar23[7] = -(cStack_241 == 'y');
              auVar23[8] = -(cStack_240 == 'j');
              auVar23[9] = -(cStack_23f == 'q');
              auVar23[10] = -(cStack_23e == 'p');
              auVar23[0xb] = -(cStack_23d == 'v');
              auVar23[0xc] = -(cStack_23c == 'o');
              auVar23[0xd] = -(cStack_23b == 'z');
              auVar23[0xe] = -(cStack_23a == 'x');
              auVar23[0xf] = -(cStack_239 == 'm');
              auVar23 = auVar23 & auVar27;
              if ((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar23[0xf] >> 7) << 0xf) != 0xffff) {
                TEST_RESULTS = TEST_RESULTS + 1;
                printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/qsort_s.c, line %d - %s\n"
                       ,0xbf,"strcmp( s, presort ) == 0");
              }
              auVar24[0] = -((byte)local_248 == 0x73);
              auVar24[1] = -(local_248._1_1_ == 'h');
              auVar24[2] = -(local_248._2_1_ == 'r');
              auVar24[3] = -(local_248._3_1_ == 'e');
              auVar24[4] = -(cStack_244 == 'i');
              auVar24[5] = -(cStack_243 == 'c');
              auVar24[6] = -(cStack_242 == 'n');
              auVar24[7] = -(cStack_241 == 'y');
              auVar24[8] = -(cStack_240 == 'j');
              auVar24[9] = -(cStack_23f == 'q');
              auVar24[10] = -(cStack_23e == 'p');
              auVar24[0xb] = -(cStack_23d == 'v');
              auVar24[0xc] = -(cStack_23c == 'o');
              auVar24[0xd] = -(cStack_23b == 'z');
              auVar24[0xe] = -(cStack_23a == 'x');
              auVar24[0xf] = -(cStack_239 == 'm');
              auVar28[0] = -(local_248._3_1_ == 'e');
              auVar28[1] = -(cStack_244 == 'i');
              auVar28[2] = -(cStack_243 == 'c');
              auVar28[3] = -(cStack_242 == 'n');
              auVar28[4] = -(cStack_241 == 'y');
              auVar28[5] = -(cStack_240 == 'j');
              auVar28[6] = -(cStack_23f == 'q');
              auVar28[7] = -(cStack_23e == 'p');
              auVar28[8] = -(cStack_23d == 'v');
              auVar28[9] = -(cStack_23c == 'o');
              auVar28[10] = -(cStack_23b == 'z');
              auVar28[0xb] = -(cStack_23a == 'x');
              auVar28[0xc] = -(cStack_239 == 'm');
              auVar28[0xd] = -(cStack_238 == 'b');
              auVar28[0xe] = -(cStack_237 == 't');
              auVar28[0xf] = -(acStack_236[0] == '\0');
              auVar24 = auVar24 & auVar28;
              if ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar24[0xf] >> 7) << 0xf) != 0xffff) {
                TEST_RESULTS = TEST_RESULTS + 1;
                printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/qsort_s.c, line %d - %s\n"
                       ,0xc4,"strcmp( s, presort ) == 0");
              }
              return TEST_RESULTS;
            }
            puVar16 = puVar17 + -2;
            pbVar3 = (byte *)puVar17[-2];
            pbVar2 = (byte *)puVar17[-1];
          } while( true );
        }
        puVar16 = puVar17 + -2;
        puVar1 = (uint *)puVar17[-2];
        puVar4 = (uint *)puVar17[-1];
      } while( true );
    }
    puVar16 = puVar17 + -2;
    puVar1 = (uint *)puVar17[-2];
    puVar5 = (uint *)puVar17[-1];
  } while( true );
}

Assistant:

int main( void )
{
#if ! defined( REGTEST ) || defined( __STDC_LIB_EXT1__ )
    char presort[] = { "shreicnyjqpvozxmbt" };
    char sorted1[] = { "bcehijmnopqrstvxyz" };
    char sorted2[] = { "bticjqnyozpvreshxm" };
    char s[19];
    strcpy( s, presort );
    qsort_s( s, 18, 1, compare, NULL );
    TESTCASE( strcmp( s, sorted1 ) == 0 );
    strcpy( s, presort );
    qsort_s( s, 9, 2, compare, NULL );
    TESTCASE( strcmp( s, sorted2 ) == 0 );
    strcpy( s, presort );
    qsort_s( s, 1, 1, compare, NULL );
    TESTCASE( strcmp( s, presort ) == 0 );
#if defined( REGTEST ) && ( defined( __BSD_VISIBLE ) || defined( __APPLE__ ) )
    puts( "qsort_s.c: Skipping test #4 for BSD as it goes into endless loop here." );
#else
    qsort_s( s, 100, 0, compare, NULL );
    TESTCASE( strcmp( s, presort ) == 0 );
#endif
#endif
    return TEST_RESULTS;
}